

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

void __thiscall
btGeneric6DofSpring2Constraint::calculateLinearInfo(btGeneric6DofSpring2Constraint *this)

{
  btVector3 *pbVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  int i;
  long lVar11;
  int iVar12;
  btVector3 *pbVar13;
  btScalar bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  uVar8 = *(undefined8 *)(this->m_calculatedTransformB).m_origin.m_floats;
  uVar9 = *(undefined8 *)(this->m_calculatedTransformA).m_origin.m_floats;
  auVar10._4_4_ = (float)((ulong)uVar8 >> 0x20) - (float)((ulong)uVar9 >> 0x20);
  auVar10._0_4_ = (float)uVar8 - (float)uVar9;
  auVar10._8_4_ =
       (this->m_calculatedTransformB).m_origin.m_floats[2] -
       (this->m_calculatedTransformA).m_origin.m_floats[2];
  auVar10._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_calculatedLinearDiff).m_floats = auVar10;
  fVar2 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
  fVar3 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
  fVar4 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
  uVar8 = *(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[1].m_floats + 1);
  uVar9 = *(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[2].m_floats + 1);
  fVar16 = (float)uVar8;
  fVar18 = (float)((ulong)uVar8 >> 0x20);
  fVar22 = (float)uVar9;
  fVar24 = (float)((ulong)uVar9 >> 0x20);
  uVar8 = *(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 1);
  fVar20 = (float)uVar8;
  fVar21 = (float)((ulong)uVar8 >> 0x20);
  fVar17 = fVar16 * fVar24 - fVar22 * fVar18;
  fVar19 = fVar18 * fVar2 - fVar24 * fVar3;
  fVar15 = fVar3 * fVar22 - fVar2 * fVar16;
  fVar23 = 1.0 / (fVar21 * fVar15 + fVar4 * fVar17 + fVar19 * fVar20);
  fVar5 = (this->m_calculatedLinearDiff).m_floats[1];
  fVar6 = (this->m_calculatedLinearDiff).m_floats[0];
  fVar7 = (this->m_calculatedLinearDiff).m_floats[2];
  *(ulong *)(this->m_calculatedLinearDiff).m_floats =
       CONCAT44(fVar7 * (fVar3 * fVar21 - fVar18 * fVar4) * fVar23 +
                fVar6 * fVar19 * fVar23 + fVar5 * (fVar4 * fVar24 + -fVar21 * fVar2) * fVar23,
                fVar7 * (fVar18 * fVar20 - fVar16 * fVar21) * fVar23 +
                fVar6 * fVar17 * fVar23 + fVar5 * (fVar21 * fVar22 + -fVar20 * fVar24) * fVar23);
  *(ulong *)((this->m_calculatedLinearDiff).m_floats + 2) =
       (ulong)(uint)((fVar2 * fVar20 + -fVar4 * fVar22) * fVar23 * fVar5 + fVar15 * fVar23 * fVar6 +
                    (fVar4 * fVar16 - fVar3 * fVar20) * fVar23 * fVar7);
  pbVar1 = &(this->m_linearLimits).m_currentLimitError;
  lVar11 = 0;
  do {
    fVar2 = (this->m_calculatedLinearDiff).m_floats[lVar11];
    (this->m_linearLimits).m_currentLinearDiff.m_floats[lVar11] = fVar2;
    fVar3 = (this->m_linearLimits).m_lowerLimit.m_floats[lVar11];
    fVar4 = (this->m_linearLimits).m_upperLimit.m_floats[lVar11];
    bVar14 = 0.0;
    iVar12 = 0;
    pbVar13 = pbVar1;
    if (fVar3 <= fVar4) {
      bVar14 = fVar2 - fVar3;
      iVar12 = 3;
      if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
        (this->m_linearLimits).m_currentLimitError.m_floats[lVar11] = bVar14;
        bVar14 = fVar2 - fVar4;
        iVar12 = 4;
        pbVar13 = &(this->m_linearLimits).m_currentLimitErrorHi;
      }
    }
    pbVar13->m_floats[lVar11] = bVar14;
    (this->m_linearLimits).m_currentLimit[lVar11] = iVar12;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  return;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v1, const btVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API)  && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(
			v1.m_floats[0] - v2.m_floats[0],
			v1.m_floats[1] - v2.m_floats[1],
			v1.m_floats[2] - v2.m_floats[2]);
#endif
}